

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

ON_BoundingBox * __thiscall
ON_Outline::OutlineBoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_Outline *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  ON_BoundingBox bbox;
  ON_BoundingBox local_60;
  
  if (this->m_bbox_status == '\0') {
    this->m_bbox_status = '\a';
    dVar5 = ON_BoundingBox::NanBoundingBox.m_max.z;
    dVar4 = ON_BoundingBox::NanBoundingBox.m_max.y;
    dVar3 = ON_BoundingBox::NanBoundingBox.m_max.x;
    dVar2 = ON_BoundingBox::NanBoundingBox.m_min.z;
    dVar1 = ON_BoundingBox::NanBoundingBox.m_min.y;
    (this->m_bbox).m_min.x = ON_BoundingBox::NanBoundingBox.m_min.x;
    (this->m_bbox).m_min.y = dVar1;
    (this->m_bbox).m_min.z = dVar2;
    (this->m_bbox).m_max.x = dVar3;
    (this->m_bbox).m_max.y = dVar4;
    (this->m_bbox).m_max.z = dVar5;
    uVar7 = (ulong)(uint)(this->m_figures).m_count;
    if (uVar7 != 0) {
      ON_OutlineFigure::BoundingBox(&bbox,(this->m_figures).m_a);
      for (lVar8 = 0x48; uVar7 * 0x48 - lVar8 != 0; lVar8 = lVar8 + 0x48) {
        ON_OutlineFigure::BoundingBox
                  (&local_60,
                   (ON_OutlineFigure *)((long)&((this->m_figures).m_a)->m_units_per_em + lVar8));
        ON_BoundingBox::Union(&bbox,&local_60);
      }
      bVar6 = ON_BoundingBox::IsValid(&bbox);
      if (bVar6) {
        bVar6 = ON_BoundingBox::IsNotEmpty(&bbox);
        if (bVar6) {
          (this->m_bbox).m_max.y = bbox.m_max.y;
          (this->m_bbox).m_max.z = bbox.m_max.z;
          (this->m_bbox).m_min.z = bbox.m_min.z;
          (this->m_bbox).m_max.x = bbox.m_max.x;
          (this->m_bbox).m_min.x = bbox.m_min.x;
          (this->m_bbox).m_min.y = bbox.m_min.y;
          this->m_bbox_status = '\x01';
        }
      }
    }
  }
  dVar1 = (this->m_bbox).m_min.x;
  dVar2 = (this->m_bbox).m_min.y;
  dVar3 = (this->m_bbox).m_min.z;
  dVar4 = (this->m_bbox).m_max.x;
  dVar5 = (this->m_bbox).m_max.z;
  (__return_storage_ptr__->m_max).y = (this->m_bbox).m_max.y;
  (__return_storage_ptr__->m_max).z = dVar5;
  (__return_storage_ptr__->m_min).z = dVar3;
  (__return_storage_ptr__->m_max).x = dVar4;
  (__return_storage_ptr__->m_min).x = dVar1;
  (__return_storage_ptr__->m_min).y = dVar2;
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_Outline::OutlineBoundingBox() const
{
  while (0 == m_bbox_status)
  {
    m_bbox_status = 7;
    m_bbox = ON_BoundingBox::NanBoundingBox;

    const unsigned int figure_count = m_figures.UnsignedCount();
    if (0 == figure_count)
      break;

    ON_BoundingBox bbox = m_figures[0].BoundingBox();
    for (unsigned int i = 1; i < figure_count; i++)
    {
      bbox.Union(m_figures[i].BoundingBox());
    }
    if (bbox.IsValid() && bbox.IsNotEmpty())
    {
      m_bbox = bbox;
      m_bbox_status = 1;
    }
    
    break;
  }

  return m_bbox;
}